

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O3

void test_2d_static<1ul,5ul,1ul,1ul,30ul,30ul>(void)

{
  int line;
  long lVar1;
  int j_1;
  ulong uVar2;
  char *expr2;
  bool *pbVar3;
  int i;
  long lVar4;
  int i_1;
  size_t true_idx;
  int dptr [961];
  bool *local_f70;
  bool *local_f68;
  bool *local_f60;
  bool *local_f58;
  bool *local_f50;
  bool *local_f48;
  long local_f40;
  bool local_f38 [3848];
  
  local_f38[0] = true;
  local_f68 = (bool *)CONCAT71(local_f68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x26,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,local_f38,(bool *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x28,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(int *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)CONCAT44(local_f68._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x29,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(int *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2b,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x3c1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x2c,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f68 = (bool *)CONCAT71(local_f68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x34,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,local_f38,(bool *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x36,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x37,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = false;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x39,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)local_f38,(unsigned_long *)&local_f68);
  local_f38[0] = true;
  local_f38[1] = true;
  local_f38[2] = false;
  local_f38[3] = false;
  local_f38[4] = false;
  local_f38[5] = false;
  local_f38[6] = false;
  local_f38[7] = false;
  local_f68 = (bool *)0x3c1;
  pbVar3 = local_f38;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0x3a,
             "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)pbVar3,(unsigned_long *)&local_f68);
  lVar1 = 0;
  local_f58 = (bool *)0x0;
  do {
    lVar4 = 0;
    local_f60 = pbVar3;
    do {
      local_f70 = (bool *)(lVar1 + lVar4);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x44,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x46,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      pbVar3[0] = true;
      pbVar3[1] = false;
      pbVar3[2] = false;
      pbVar3[3] = false;
      local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x4a,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar3,(int *)&local_f70);
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar3 + 4;
    } while (lVar4 != 0x1e);
    local_f58 = (bool *)((long)local_f58 + 1);
    lVar1 = lVar1 + 0x1f;
    pbVar3 = local_f60 + 0x7c;
  } while (local_f58 != (bool *)0x1e);
  pbVar3 = local_f38;
  local_f60 = (bool *)0x0;
  lVar1 = 0;
  do {
    lVar4 = 0;
    local_f58 = pbVar3;
    while( true ) {
      local_f70 = (bool *)((long)local_f60 + lVar4);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x53,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x55,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      if (lVar4 == 0x1e) break;
      if (lVar1 == 0x1e) {
        pbVar3[0] = true;
        pbVar3[1] = false;
        pbVar3[2] = false;
        pbVar3[3] = false;
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x18);
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","24",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,100,
                   "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,(int *)pbVar3,(int *)&local_f70);
      }
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar3 + 4;
    }
    pbVar3[0] = true;
    pbVar3[1] = false;
    pbVar3[2] = false;
    pbVar3[3] = false;
    local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x5c,
               "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar3,(int *)&local_f70);
    lVar1 = lVar1 + 1;
    local_f60 = (bool *)((long)local_f60 + 0x1f);
    pbVar3 = local_f58 + 0x7c;
  } while (lVar1 != 0x1f);
  pbVar3 = local_f38;
  local_f58 = (bool *)0x0;
  local_f60 = (bool *)0x0;
  lVar1 = 0;
  do {
    lVar4 = 0;
    local_f48 = pbVar3;
    local_f40 = lVar1;
    do {
      local_f68 = (bool *)((long)local_f60 + lVar4);
      local_f70 = (bool *)((long)local_f58 + lVar4);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x70,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x72,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      pbVar3[0] = true;
      pbVar3[1] = false;
      pbVar3[2] = false;
      pbVar3[3] = false;
      local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x76,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar3,(int *)&local_f70);
      lVar4 = lVar4 + 1;
      pbVar3 = pbVar3 + 4;
    } while (lVar4 != 0x1e);
    lVar1 = local_f40 + 1;
    local_f60 = (bool *)((long)local_f60 + 0x9b);
    pbVar3 = local_f48 + 0x25c;
    local_f58 = (bool *)((long)local_f58 + 0x97);
  } while (lVar1 != 6);
  pbVar3 = local_f38;
  local_f60 = (bool *)0x0;
  uVar2 = 0;
  do {
    local_f58 = (bool *)(uVar2 % 5);
    lVar1 = 0;
    local_f48 = pbVar3;
    while( true ) {
      local_f70 = (bool *)((long)local_f60 + lVar1);
      local_f68 = local_f70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x7f,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_f70,(unsigned_long *)&local_f68);
      local_f50 = local_f38 + (long)local_f68 * 4;
      local_f70 = pbVar3;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x81,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_f70,(int **)&local_f50);
      if (lVar1 == 0x1e) break;
      if (uVar2 == 0x1e) {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x18);
        expr2 = "24";
        line = 0x8c;
      }
      else if (local_f58 == (bool *)0x0) {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x47);
        expr2 = "71";
        line = 0x97;
      }
      else {
        local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x2a);
        expr2 = "42";
        line = 0x9c;
      }
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])",expr2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,line,
                 "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int *)pbVar3,(int *)&local_f70);
      lVar1 = lVar1 + 1;
      pbVar3 = pbVar3 + 4;
    }
    local_f70 = (bool *)CONCAT44(local_f70._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
               ,0x86,
               "void test_2d_static() [StepX = 1UL, StepY = 5UL, PadX = 1UL, PadY = 1UL, X = 30UL, Y = 30UL]"
               ,(int *)pbVar3,(int *)&local_f70);
    uVar2 = uVar2 + 1;
    local_f60 = (bool *)((long)local_f60 + 0x1f);
    pbVar3 = local_f48 + 0x7c;
  } while (uVar2 != 0x1f);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % StepX), "X must be divisable by StepX");
    static_assert(0 == (Y % StepY), "Y must be divisable by StepY");

    layout_mapping_left<
        dimensions<X, Y>
      , dimensions<1, 1>
      , dimensions<PadX, PadY>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<X / StepX, Y / StepY>
      , dimensions<StepX, StepY>
      , dimensions<PadX, PadY>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    int dptr[(X + PadX) * (Y + PadY)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
            }
        }
    }
}